

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall Imf_2_5::Header::readFrom(Header *this,IStream *is,int *version)

{
  ostream *poVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  char *pcVar6;
  OpaqueAttribute *this_00;
  mapped_type *ppAVar7;
  size_t sVar8;
  InputExc *pIVar9;
  key_type *typeName_00;
  int iVar10;
  long lVar11;
  char name [256];
  char b [4];
  char typeName [256];
  char local_3c8 [264];
  key_type local_2c0;
  Attribute local_138 [33];
  
  iVar10 = 0;
  do {
    lVar11 = 0;
    do {
      (*is->_vptr_IStream[3])(is,local_3c8 + lVar11,1);
      if (local_3c8[lVar11] == '\0') break;
      iVar4 = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar4 != 0xff);
    if (local_3c8[0] == '\0') {
      this->_readsNothing = iVar10 == 0;
      return;
    }
    (anonymous_namespace)::checkIsNullTerminated<256ul>((char (*) [256])local_3c8,"attribute name");
    lVar11 = 0;
    do {
      pcVar6 = (char *)((long)&local_138[0]._vptr_Attribute + lVar11);
      (*is->_vptr_IStream[3])(is,pcVar6,1);
      if (*pcVar6 == '\0') break;
      iVar4 = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar4 != 0xff);
    (anonymous_namespace)::checkIsNullTerminated<256ul>
              ((char (*) [256])local_138,"attribute type name");
    (*is->_vptr_IStream[3])(is,&local_2c0,4);
    uVar2 = local_2c0._text._0_4_;
    if ((int)local_2c0._text._0_4_ < 0) {
      pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar9,"Invalid size field in header attribute");
      __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    iVar10 = iVar10 + 1;
    strncpy(local_2c0._text,local_3c8,0xff);
    local_2c0._text[0xff] = '\0';
    typeName_00 = &local_2c0;
    iVar5 = std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
            ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                    *)this,&local_2c0);
    if ((_Rb_tree_header *)iVar5._M_node == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
      bVar3 = Attribute::knownType(local_138,typeName_00->_text);
      if (bVar3) {
        this_00 = (OpaqueAttribute *)Attribute::newAttribute(local_138,typeName_00->_text);
      }
      else {
        this_00 = (OpaqueAttribute *)operator_new(0x40);
        OpaqueAttribute::OpaqueAttribute(this_00,(char *)local_138);
      }
      (*(this_00->super_Attribute)._vptr_Attribute[5])
                (this_00,is,(ulong)(uint)uVar2,(ulong)(uint)*version);
      strncpy(local_2c0._text,local_3c8,0xff);
      local_2c0._text[0xff] = '\0';
      ppAVar7 = std::
                map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
                ::operator[](&this->_map,&local_2c0);
      *ppAVar7 = &this_00->super_Attribute;
    }
    else {
      pcVar6 = (char *)(**(code **)(**(long **)(iVar5._M_node + 9) + 0x10))();
      iVar4 = strncmp(pcVar6,(char *)local_138,0x100);
      if (iVar4 != 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&local_2c0);
        poVar1 = (ostream *)(local_2c0._text + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar1,"Unexpected type for image attribute \"",0x25);
        sVar8 = strlen(local_3c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_3c8,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\".",2);
        pIVar9 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar9,(stringstream *)&local_2c0);
        __cxa_throw(pIVar9,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
      }
      (**(code **)(**(long **)(iVar5._M_node + 9) + 0x28))
                (*(long **)(iVar5._M_node + 9),is,uVar2,*version);
    }
  } while( true );
}

Assistant:

void
Header::readFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int &version)
{
    //
    // Read all attributes.
    //

    int attrCount = 0;

    while (true)
    {
	//
	// Read the name of the attribute.
	// A zero-length attribute name indicates the end of the header.
	//

	char name[Name::SIZE];
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, Name::MAX_LENGTH, name);

	if (name[0] == 0)
	{
	    if (attrCount == 0) _readsNothing = true;
	    else                _readsNothing = false;
	    break;
	}

	attrCount++;

	checkIsNullTerminated (name, "attribute name");

	//
	// Read the attribute type and the size of the attribute value.
	//

	char typeName[Name::SIZE];
	int size;

	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, Name::MAX_LENGTH, typeName);
	checkIsNullTerminated (typeName, "attribute type name");
	OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, size);

    if( size < 0 )
    {
        throw IEX_NAMESPACE::InputExc("Invalid size field in header attribute");
    }

	AttributeMap::iterator i = _map.find (name);

	if (i != _map.end())
	{
	    //
	    // The attribute already exists (for example,
	    // because it is a predefined attribute).
	    // Read the attribute's new value from the file.
	    //

	    if (strncmp (i->second->typeName(), typeName, sizeof (typeName)))
		THROW (IEX_NAMESPACE::InputExc, "Unexpected type for image attribute "
				      "\"" << name << "\".");

	    i->second->readValueFrom (is, size, version);
	}
	else
	{
	    //
	    // The new attribute does not exist yet.
	    // If the attribute type is of a known type,
	    // read the attribute value.  If the attribute
	    // is of an unknown type, read its value and
	    // store it as an OpaqueAttribute.
	    //

	    Attribute *attr;

	    if (Attribute::knownType (typeName))
		attr = Attribute::newAttribute (typeName);
	    else
		attr = new OpaqueAttribute (typeName);

	    try
	    {
		attr->readValueFrom (is, size, version);
		_map[name] = attr;
	    }
	    catch (...)
	    {
		delete attr;
		throw;
	    }
	}
    }
}